

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void regul1(qnode_ptr_t f,int n,int sf,float trsh)

{
  int iVar1;
  int iVar2;
  undefined4 in_XMM0_Db;
  int local_a34;
  int k;
  int j;
  int i;
  int yf;
  int xf;
  int num;
  float det;
  float cond_num;
  disp_vect_t u;
  pos_t rep_loc;
  pos_t sample [316];
  float trsh_local;
  int sf_local;
  int n_local;
  qnode_ptr_t f_local;
  
  iVar1 = (int)((double)((((f->sizx - f->ofst) + -4) - (f->ofst + 4)) % n) / 2.0 + 0.5);
  iVar2 = (int)((double)((((f->sizy - f->ofst) + -4) - (f->ofst + 4)) % n) / 2.0 + 0.5);
  KERNEL_X = iVar1 + KERNEL_X;
  KERNEL_Y = iVar2 + KERNEL_Y;
  for (k = f->ofst + 4 + iVar2; k < ((f->sizy - f->ofst) + -4) - iVar2; k = n + k) {
    for (local_a34 = f->ofst + 4 + iVar1; local_a34 < ((f->sizx - f->ofst) + -4) - iVar1;
        local_a34 = n + local_a34) {
      min_discr(f,k,local_a34,n,&rep_loc,&yf);
      u = (disp_vect_t)
          min_cond(&rep_loc,f,n,yf,SUB84((double)(float)(double)CONCAT44(in_XMM0_Db,trsh),0),sf);
      _det = vector((pos_t)u,f);
      num = (int)condition((pos_t)u,f);
      xf = (int)determinant((pos_t)u,f);
      propagate(_det,SUB84((double)(float)xf,0),SUB84((double)(float)num,0),f,k,local_a34,n);
    }
  }
  return;
}

Assistant:

void regul1(f,n,sf,trsh)
qnode_ptr_t f ;
int n, sf ;
float trsh ;

{ pos_t min_cond(), sample[X], rep_loc ;
  disp_vect_t vector(), u ;
  float condition(), determinant(), cond_num, det ;
  int num, xf, yf, i, j, k ;

  xf = (int)(((f->sizx-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  yf = (int)(((f->sizy-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  KERNEL_X += xf ;
  KERNEL_Y += yf ;

  for (i = f->ofst+NRADIUS+yf ; i < f->sizy-f->ofst-NRADIUS-yf ; i += n) {
    for (j = f->ofst+NRADIUS+xf ; j < f->sizx-f->ofst-NRADIUS-xf ; j += n) {
      min_discr(f,i,j,n,sample,&num) ;
      rep_loc = min_cond(sample,f,n,num,trsh,sf) ;
      u = vector(rep_loc,f) ;
      cond_num = condition(rep_loc,f) ;
      det = determinant(rep_loc,f) ;
      propagate(u,det,cond_num,f,i,j,n) ;
    }
  }
}